

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O2

bool __thiscall DAGPropagator::propagateNewNode(DAGPropagator *this,int n)

{
  pointer pvVar1;
  uint *puVar2;
  bool bVar3;
  uint *puVar4;
  size_type __n;
  reference rVar5;
  
  bVar3 = DReachabilityPropagator::propagateNewNode(&this->super_DReachabilityPropagator,n);
  if (bVar3) {
    __n = (size_type)n;
    pvVar1 = (this->super_DReachabilityPropagator).in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (uint *)pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar4 = *(uint **)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
        _vptr_Propagator[0x19])(this,(ulong)*puVar4);
    }
    pvVar1 = (this->super_DReachabilityPropagator).ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (uint *)pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar4 = *(uint **)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
        _vptr_Propagator[0x19])(this,(ulong)*puVar4);
    }
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->processed_n,__n);
    *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
  }
  return bVar3;
}

Assistant:

bool DAGPropagator::propagateNewNode(int n) {
	if (!DReachabilityPropagator::propagateNewNode(n)) {
		return false;
	}

	for (const int i : in[n]) {
		prevent_cycle(i);
	}
	for (const int i : ou[n]) {
		prevent_cycle(i);
	}

	processed_n[n] = true;
	return true;
}